

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

void helics::CoreFactory::defineCoreBuilder
               (shared_ptr<helics::CoreFactory::CoreBuilder> *builder,string_view name,int code)

{
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  shared_ptr<helics::CoreFactory::CoreBuilder> *this;
  string_view in_stack_ffffffffffffffa8;
  shared_ptr<helics::CoreFactory::CoreBuilder> local_30 [3];
  
  this = local_30;
  std::shared_ptr<helics::CoreFactory::CoreBuilder>::shared_ptr
            (this,(shared_ptr<helics::CoreFactory::CoreBuilder> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  MasterCoreBuilder::addBuilder(this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff9c);
  std::shared_ptr<helics::CoreFactory::CoreBuilder>::~shared_ptr
            ((shared_ptr<helics::CoreFactory::CoreBuilder> *)0x42d9ca);
  return;
}

Assistant:

void defineCoreBuilder(std::shared_ptr<CoreBuilder> builder, std::string_view name, int code)
{
    MasterCoreBuilder::addBuilder(std::move(builder), name, code);
}